

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int IoCommandWriteCnf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  uint fVerbose;
  char *pcVar6;
  uint local_3c;
  
  bVar3 = false;
  Extra_UtilGetoptReset();
  bVar1 = true;
  bVar2 = false;
  local_3c = 1;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar4 = Extra_UtilGetopt(argc,argv,"nfpcvh"), iVar4 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar4 < 0x66) break;
      if (iVar4 == 0x66) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else if (iVar4 == 0x70) {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else {
        if (iVar4 != 0x6e) goto LAB_002c3f08;
        bVar1 = (bool)(bVar1 ^ 1);
      }
    }
    if (iVar4 == -1) break;
    if (iVar4 != 99) goto LAB_002c3f08;
    local_3c = local_3c ^ 1;
  }
  if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
    fwrite("Empty network.\n",0xf,1,(FILE *)pAbc->Out);
  }
  else {
    if (globalUtilOptind + 1 != argc) {
LAB_002c3f08:
      fwrite("usage: write_cnf [-nfpcvh] <file>\n",0x22,1,(FILE *)pAbc->Err);
      fwrite("\t         generates CNF for the miter (see also \"&write_cnf\")\n",0x3e,1,
             (FILE *)pAbc->Err);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-n     : toggle using new algorithm [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (!bVar3) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-f     : toggle using fast algorithm [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (!bVar2) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-p     : toggle using all primes to enhance implicativity [default = %s]\n",pcVar5)
      ;
      pcVar5 = "yes";
      if (local_3c == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-c     : toggle adjasting polarity of internal variables [default = %s]\n",pcVar5);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",
              pcVar6);
      fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
      fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
      return 1;
    }
    pcVar5 = argv[globalUtilOptind];
    if (bVar2 && pAbc->pNtkCur->ntkType == ABC_NTK_STRASH) {
      puts("Warning: Selected option to write all primes has no effect when deriving CNF from AIG.")
      ;
      bVar2 = false;
    }
    if (bVar3) {
      Abc_NtkDarToCnf(pAbc->pNtkCur,pcVar5,1,local_3c,fVerbose);
    }
    else {
      if (bVar1) {
        Abc_NtkDarToCnf(pAbc->pNtkCur,pcVar5,0,local_3c,fVerbose);
        return 0;
      }
      if (bVar2) {
        Io_WriteCnf(pAbc->pNtkCur,pcVar5,1);
      }
      else {
        Io_Write(pAbc->pNtkCur,pcVar5,IO_FILE_CNF);
      }
    }
  }
  return 0;
}

Assistant:

int IoCommandWriteCnf( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int c;
    int fNewAlgo;
    int fFastAlgo;
    int fAllPrimes;
    int fChangePol;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkDarToCnf( Abc_Ntk_t * pNtk, char * pFileName, int fFastAlgo, int fChangePol, int fVerbose );

    fNewAlgo = 1;
    fFastAlgo = 0;
    fAllPrimes = 0;
    fChangePol = 1;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nfpcvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'n':
                fNewAlgo ^= 1;
                break;
            case 'f':
                fFastAlgo ^= 1;
                break;
            case 'p':
                fAllPrimes ^= 1;
                break;
            case 'c':
                fChangePol ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // check if the feature will be used
    if ( Abc_NtkIsStrash(pAbc->pNtkCur) && fAllPrimes )
    {
        fAllPrimes = 0;
        printf( "Warning: Selected option to write all primes has no effect when deriving CNF from AIG.\n" );
    }
    // call the corresponding file writer
    if ( fFastAlgo )
        Abc_NtkDarToCnf( pAbc->pNtkCur, pFileName, 1, fChangePol, fVerbose );
    else if ( fNewAlgo )
        Abc_NtkDarToCnf( pAbc->pNtkCur, pFileName, 0, fChangePol, fVerbose );
    else if ( fAllPrimes )
        Io_WriteCnf( pAbc->pNtkCur, pFileName, 1 );
    else
        Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_CNF );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_cnf [-nfpcvh] <file>\n" );
    fprintf( pAbc->Err, "\t         generates CNF for the miter (see also \"&write_cnf\")\n" );
    fprintf( pAbc->Err, "\t-n     : toggle using new algorithm [default = %s]\n", fNewAlgo? "yes" : "no" );
    fprintf( pAbc->Err, "\t-f     : toggle using fast algorithm [default = %s]\n", fFastAlgo? "yes" : "no" );
    fprintf( pAbc->Err, "\t-p     : toggle using all primes to enhance implicativity [default = %s]\n", fAllPrimes? "yes" : "no" );
    fprintf( pAbc->Err, "\t-c     : toggle adjasting polarity of internal variables [default = %s]\n", fChangePol? "yes" : "no" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}